

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

Var Js::JavascriptObject::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  JavascriptLibrary *this;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  DynamicObject *pDVar7;
  RecyclableObject *this_00;
  Type TVar8;
  int in_stack_00000010;
  Arguments local_70;
  DynamicObject *local_60;
  RecyclableObject *result;
  ScriptContext *local_50;
  undefined1 auStack_48 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0xd,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cee509;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_48 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)auStack_48,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  this = (pSVar1->super_ScriptContextBase).javascriptLibrary;
  if (((ulong)auStack_48 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x11,"(args.HasArg())","Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00cee509;
    *puVar5 = 0;
  }
  pRVar6 = (RecyclableObject *)
           CallInfo::GetNewTarget
                     ((uint)auStack_48._0_4_ >> 0x18,(Var *)args.super_Arguments.Info,
                      auStack_48._0_4_ & 0xffffff);
  local_70.Info = (Type)auStack_48;
  local_70.Values = (Type)args.super_Arguments.Info;
  bVar3 = JavascriptOperators::GetAndAssertIsConstructorSuperCall(&local_70);
  if (pRVar6 == function || !bVar3) {
    if (((ulong)auStack_48 & 0xfffffe) == 0) {
      pDVar7 = (DynamicObject *)(this->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      pDVar7 = (DynamicObject *)Arguments::operator[]((Arguments *)auStack_48,1);
    }
    if (pDVar7 == (DynamicObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00cee509;
      *puVar5 = 0;
    }
    result = (RecyclableObject *)this;
    if (((ulong)pDVar7 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pDVar7 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00cee509;
      *puVar5 = 0;
    }
    pRVar6 = result;
    TVar8 = TypeIds_FirstNumberType;
    local_50 = pSVar1;
    if ((((ulong)pDVar7 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar8 = TypeIds_Number, (ulong)pDVar7 >> 0x32 == 0)) {
      this_00 = UnsafeVarTo<Js::RecyclableObject>(pDVar7);
      if (this_00 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00cee509;
        *puVar5 = 0;
      }
      TVar8 = ((this_00->type).ptr)->typeId;
      if ((0x57 < (int)TVar8) && (BVar4 = RecyclableObject::IsExternal(this_00), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) goto LAB_00cee509;
        *puVar5 = 0;
      }
    }
    local_60 = pDVar7;
    if ((0x38 < TVar8 - TypeIds_Function) ||
       ((0x10000200000dfc7U >> ((ulong)(TVar8 - TypeIds_Function) & 0x3f) & 1) == 0)) {
      if (TVar8 < TypeIds_Boolean) {
        if (((ulong)args.super_Arguments.Values & 0x10000000) == 0) {
          local_60 = JavascriptLibrary::CreateObject((JavascriptLibrary *)pRVar6,true,0);
        }
      }
      else {
        local_60 = (DynamicObject *)0x0;
        JavascriptConversion::ToObject(pDVar7,local_50,(RecyclableObject **)&local_60);
        if (local_60 == (DynamicObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                      ,0x3c,"(result)","result");
          if (!bVar3) {
LAB_00cee509:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
      }
    }
  }
  else {
    pRVar6 = VarTo<Js::RecyclableObject>(pRVar6);
    pDVar7 = JavascriptLibrary::CreateObject(this,true,0);
    local_60 = (DynamicObject *)
               JavascriptOperators::OrdinaryCreateFromConstructor
                         (pRVar6,&pDVar7->super_RecyclableObject,(DynamicObject *)0x0,pSVar1);
  }
  return local_60;
}

Assistant:

Var JavascriptObject::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    JavascriptLibrary* library = scriptContext->GetLibrary();

    AssertMsg(args.HasArg(), "Should always have implicit 'this'");

    Var newTarget = args.GetNewTarget();
    if (JavascriptOperators::GetAndAssertIsConstructorSuperCall(args) &&
        newTarget != function)
    {
        return JavascriptOperators::OrdinaryCreateFromConstructor(
            VarTo<RecyclableObject>(newTarget),
            library->CreateObject(true),
            nullptr,
            scriptContext);
    }

    Var arg = args.Info.Count > 1 ? args[1] : library->GetUndefined();
    switch (JavascriptOperators::GetTypeId(arg))
    {
        case TypeIds_Undefined:
        case TypeIds_Null:
            // Null and undefined result in a new object
            return (callInfo.Flags & CallFlags_NotUsed)
                ? arg
                : library->CreateObject(true);

        case TypeIds_StringObject:
        case TypeIds_Function:
        case TypeIds_Array:
        case TypeIds_ES5Array:
        case TypeIds_RegEx:
        case TypeIds_NumberObject:
        case TypeIds_SIMDObject:
        case TypeIds_Date:
        case TypeIds_BooleanObject:
        case TypeIds_Error:
        case TypeIds_Object:
        case TypeIds_Arguments:
        case TypeIds_ActivationObject:
        case TypeIds_SymbolObject:
            // Since we know this is an object, we can skip ToObject
            return arg;
    }

    RecyclableObject* result = nullptr;
    JavascriptConversion::ToObject(arg, scriptContext, &result);
    Assert(result);
    return result;
}